

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

value * __thiscall mjs::regexp_object::get_source(value *__return_storage_ptr__,regexp_object *this)

{
  gc_heap_ptr<mjs::gc_string> local_38;
  string local_28;
  regexp_object *local_18;
  regexp_object *this_local;
  
  local_18 = this;
  this_local = (regexp_object *)__return_storage_ptr__;
  object::heap((object *)this);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&local_38,(gc_heap *)&this->source_);
  string::string(&local_28,&local_38);
  value::value(__return_storage_ptr__,&local_28);
  string::~string(&local_28);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

value get_source() const {
        return value{source_.track(heap())};
    }